

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

Maybe<capnp::compiler::NodeTranslator::BrandedDecl> * __thiscall
capnp::compiler::NodeTranslator::BrandScope::compileDeclExpression
          (Maybe<capnp::compiler::NodeTranslator::BrandedDecl> *__return_storage_ptr__,
          BrandScope *this,Reader source,Resolver *resolver,ImplicitParams implicitMethodParams)

{
  uint *puVar1;
  anon_union_96_2_a774ebf0_for_OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_3
  *paVar2;
  ErrorReporter *pEVar3;
  undefined2 *puVar4;
  Reader source_00;
  Reader source_01;
  Reader source_02;
  ImplicitParams implicitMethodParams_00;
  ImplicitParams implicitMethodParams_01;
  ImplicitParams implicitMethodParams_02;
  Reader name_00;
  long lVar5;
  undefined8 uVar6;
  long *plVar7;
  NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *pNVar8;
  undefined7 uVar9;
  undefined7 uVar10;
  undefined1 uVar11;
  undefined7 uVar12;
  undefined7 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  BrandedDecl *pBVar23;
  BrandedDecl *pBVar24;
  size_t sVar25;
  uint uVar26;
  _ _Var27;
  int iVar28;
  CapTableReader *pCVar29;
  BrandScope *pBVar30;
  CapTableReader *pCVar31;
  WirePointer *pWVar32;
  undefined4 uVar33;
  ArrayPtr<const_char> *params_1;
  char *pcVar34;
  void **ppvVar35;
  SegmentReader *pSVar36;
  ulong uVar37;
  WirePointer *pWVar38;
  ArrayPtr<const_char> *pAVar39;
  ElementCount EVar40;
  ulong uVar41;
  SegmentReader *pSVar42;
  BrandedDecl *pBVar43;
  ElementCount EVar44;
  undefined1 uVar45;
  Refcounted *refcounted;
  bool bVar46;
  bool bVar47;
  uint uVar48;
  undefined4 uVar49;
  undefined4 uVar50;
  undefined4 uVar51;
  int iVar52;
  undefined4 uVar53;
  undefined4 uVar54;
  Reader RVar55;
  StringPtr memberName;
  Reader name;
  Reader param;
  ArrayBuilder<capnp::compiler::NodeTranslator::BrandedDecl> compiledParams;
  Reader name_2;
  Resolver *pRVar56;
  uint in_stack_fffffffffffffb48;
  uint uVar57;
  undefined4 in_stack_fffffffffffffb4c;
  undefined4 in_stack_fffffffffffffb54;
  undefined4 in_stack_fffffffffffffb58;
  undefined4 uVar58;
  undefined4 in_stack_fffffffffffffb5c;
  undefined4 uVar59;
  undefined4 in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffb64;
  undefined4 in_stack_fffffffffffffb68;
  undefined2 in_stack_fffffffffffffb6c;
  undefined2 in_stack_fffffffffffffb6e;
  undefined4 uStack_490;
  undefined1 local_488;
  undefined1 local_480;
  undefined7 uStack_47f;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  BrandScope *pBStack_448;
  undefined8 local_440;
  uint uStack_438;
  undefined4 uStack_434;
  undefined4 local_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  StructDataBitCount local_420;
  undefined4 uStack_41c;
  StructDataBitCount SStack_418;
  undefined4 uStack_414;
  int iStack_410;
  undefined4 uStack_40c;
  ListReader local_3f8;
  undefined1 local_3c8 [8];
  undefined1 auStack_3c0 [168];
  BrandScope *local_318;
  BrandScope *pBStack_310;
  undefined1 local_308 [12];
  undefined4 uStack_2fc;
  undefined8 local_2f8;
  WirePointer *pWStack_2f0;
  uint local_2e8;
  StructPointerCount SStack_2e4;
  undefined2 uStack_2e2;
  int iStack_2e0;
  undefined4 uStack_2dc;
  BrandedDecl *local_2d8;
  BrandedDecl *pBStack_2d0;
  BrandedDecl *local_2c8;
  ArrayDisposer *local_2c0;
  int local_2ac;
  String local_2a8;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  undefined4 local_288;
  undefined4 uStack_284;
  undefined4 uStack_280;
  undefined4 uStack_27c;
  CapTableReader *local_270;
  NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> local_268;
  Array<capnp::compiler::NodeTranslator::BrandedDecl> local_1b8;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined4 local_188;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  PointerReader local_148;
  void *local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  StructReader local_f0;
  StructReader local_c0;
  StructReader local_90;
  StructReader local_60;
  
  uVar14 = auStack_3c0[0x2f];
  uVar12 = auStack_3c0._40_7_;
  uVar45 = auStack_3c0[0x27];
  uVar9 = auStack_3c0._32_7_;
  if (source._reader.dataSize < 0x10) goto switchD_001c930a_caseD_0;
  puVar4 = (undefined2 *)source._reader.data;
  auStack_3c0[0x2f] = (undefined1)((ulong)_local_488 >> 0x38);
  uVar15 = auStack_3c0[0x2f];
  auStack_3c0._40_7_ = (undefined7)_local_488;
  uVar13 = auStack_3c0._40_7_;
  auStack_3c0[0x27] = (undefined1)((ulong)_uStack_490 >> 0x38);
  uVar11 = auStack_3c0[0x27];
  auStack_3c0._32_7_ = (undefined7)_uStack_490;
  uVar10 = auStack_3c0._32_7_;
  pSVar36 = source._reader.segment;
  pCVar31 = source._reader.capTable;
  pWVar32 = source._reader.pointers;
  auStack_3c0._32_7_ = uVar9;
  auStack_3c0[0x27] = uVar45;
  auStack_3c0._40_7_ = uVar12;
  auStack_3c0[0x2f] = uVar14;
  switch(*puVar4) {
  case 1:
  case 2:
  case 3:
  case 4:
  case 6:
  case 7:
  case 8:
  case 0xd:
    uVar37 = 0;
    if (source._reader.dataSize < 0x40) {
      uVar41 = 0;
    }
    else {
      uVar41 = (ulong)*(uint *)(puVar4 + 2);
      if (0x9f < source._reader.dataSize) {
        uVar37 = (ulong)*(uint *)(puVar4 + 8);
      }
    }
    (**this->errorReporter->_vptr_ErrorReporter)
              (this->errorReporter,uVar41,uVar37,"Expected name.",0xf);
  case 0:
switchD_001c930a_caseD_0:
    (__return_storage_ptr__->ptr).isSet = false;
    return __return_storage_ptr__;
  case 5:
    capnp::_::PointerReader::getStruct
              ((StructReader *)&local_268,(PointerReader *)&stack0xfffffffffffffb48,(word *)0x0);
    uVar33 = 0x7fffffff;
    uVar58 = 0;
    uVar59 = 0;
    if (local_268.field_1._28_2_ != 0) {
      uVar33 = local_268.field_1._32_4_;
      uVar58 = local_268.field_1._16_4_;
      uVar59 = local_268.field_1._20_4_;
    }
    uVar48 = 0;
    uVar49 = 0;
    uVar50 = 0;
    uVar53 = 0;
    if (local_268.field_1._28_2_ != 0) {
      uVar48 = local_268._0_4_;
      uVar49 = local_268._4_4_;
      uVar50 = local_268.field_1.value.body.tag;
      uVar53 = local_268.field_1._4_4_;
    }
    RVar55 = capnp::_::PointerReader::getBlob<capnp::Text>
                       ((PointerReader *)&stack0xfffffffffffffb48,(void *)0x0,0);
    pAVar39 = RVar55.super_StringPtr.content.size_;
    local_318 = RVar55.super_StringPtr.content.ptr;
    uVar37 = (ulong)implicitMethodParams.params.reader.elementCount;
    if (uVar37 != 0) {
      uVar41 = 0;
      do {
        EVar40 = (ElementCount)uVar41;
        capnp::_::ListReader::getStructElement
                  ((StructReader *)&stack0xfffffffffffffb48,&implicitMethodParams.params.reader,
                   EVar40);
        bVar46 = in_stack_fffffffffffffb6c == 0;
        auStack_3c0._8_4_ = uVar33;
        auStack_3c0._12_4_ = in_stack_fffffffffffffb64;
        if (bVar46) {
          auStack_3c0._8_4_ = 0;
          auStack_3c0._12_4_ = 0;
        }
        auStack_3c0._16_4_ = uStack_490;
        if (bVar46) {
          auStack_3c0._16_4_ = 0x7fffffff;
        }
        local_3c8._0_4_ = 0;
        local_3c8._4_4_ = 0;
        auStack_3c0._0_4_ = 0;
        auStack_3c0._4_4_ = 0;
        if (!bVar46) {
          local_3c8._0_4_ = uVar48;
          local_3c8._4_4_ = uVar49;
          auStack_3c0._0_4_ = uVar50;
          auStack_3c0._4_4_ = uVar53;
        }
        RVar55 = capnp::_::PointerReader::getBlob<capnp::Text>
                           ((PointerReader *)local_3c8,(void *)0x0,0);
        if ((RVar55.super_StringPtr.content.size_ == pAVar39) &&
           (iVar28 = bcmp(RVar55.super_StringPtr.content.ptr,local_318,
                          (size_t)((long)&pAVar39[-1].size_ + 7)), iVar28 == 0)) {
          if (implicitMethodParams.scopeId == 0) {
            (__return_storage_ptr__->ptr).field_1.value.source._reader.data = (void *)0x0;
            (__return_storage_ptr__->ptr).field_1.value.source._reader.pointers = (WirePointer *)0x0
            ;
            (__return_storage_ptr__->ptr).field_1.value.source._reader.segment =
                 (SegmentReader *)0x0;
            (__return_storage_ptr__->ptr).field_1.value.source._reader.capTable =
                 (CapTableReader *)0x0;
            pNVar8 = &__return_storage_ptr__->ptr;
            *(StructDataBitCount *)((long)&pNVar8->field_1 + 0x98) = 0;
            *(StructPointerCount *)((long)&pNVar8->field_1 + 0x9c) = 0;
            *(undefined2 *)((long)&pNVar8->field_1 + 0x9e) = 0;
            (__return_storage_ptr__->ptr).isSet = true;
            (__return_storage_ptr__->ptr).field_1.value.body.tag = 2;
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = 0;
            *(ElementCount *)((long)&(__return_storage_ptr__->ptr).field_1.value.body.field_1 + 8) =
                 EVar40;
          }
          else {
            (__return_storage_ptr__->ptr).field_1.value.source._reader.data = (void *)0x0;
            (__return_storage_ptr__->ptr).field_1.value.source._reader.pointers = (WirePointer *)0x0
            ;
            (__return_storage_ptr__->ptr).field_1.value.source._reader.segment =
                 (SegmentReader *)0x0;
            (__return_storage_ptr__->ptr).field_1.value.source._reader.capTable =
                 (CapTableReader *)0x0;
            pNVar8 = &__return_storage_ptr__->ptr;
            *(StructDataBitCount *)((long)&pNVar8->field_1 + 0x98) = 0;
            *(StructPointerCount *)((long)&pNVar8->field_1 + 0x9c) = 0;
            *(undefined2 *)((long)&pNVar8->field_1 + 0x9e) = 0;
            (__return_storage_ptr__->ptr).isSet = true;
            (__return_storage_ptr__->ptr).field_1.value.body.tag = 2;
            *(uint64_t *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
                 implicitMethodParams.scopeId;
            *(ElementCount *)((long)&(__return_storage_ptr__->ptr).field_1.value.body.field_1 + 8) =
                 EVar40 & 0xffff;
          }
          (__return_storage_ptr__->ptr).field_1.value.brand.disposer = (Disposer *)0x0;
          (__return_storage_ptr__->ptr).field_1.value.brand.ptr = (BrandScope *)0x0;
          *(undefined8 *)&(__return_storage_ptr__->ptr).field_1.value.source._reader.nestingLimit =
               0x7fffffff;
          return __return_storage_ptr__;
        }
        uVar41 = uVar41 + 1;
      } while (uVar37 != uVar41);
    }
    pBVar30 = local_318;
    params_1 = pAVar39;
    (**resolver->_vptr_Resolver)(&stack0xfffffffffffffb48,resolver,local_318);
    local_3c8[0] = SUB41(uVar48,0);
    if (SUB41(uVar48,0) != (_)0x1) {
      pEVar3 = this->errorReporter;
      local_3f8.segment = (SegmentReader *)0x264a6d;
      local_3f8.capTable = (CapTableReader *)0xd;
      register0x000000a8 = (CapTableReader *)((long)&pAVar39[-1].size_ + 7);
      local_308._0_8_ = pBVar30;
      kj::_::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                ((String *)&stack0xfffffffffffffb48,(_ *)&local_3f8,
                 (ArrayPtr<const_char> *)local_308,params_1);
      lVar5 = CONCAT44(uVar53,uVar50);
      if (lVar5 == 0) {
        pcVar34 = "";
      }
      else {
        pcVar34 = (char *)CONCAT44(uVar49,uVar48);
      }
      uVar37 = 0;
      if ((uint)local_268.field_1._24_4_ < 0x20) {
        uVar41 = 0;
      }
      else {
        uVar41 = (ulong)*(uint *)CONCAT17(local_268.field_1._15_1_,local_268.field_1._8_7_);
        if (0x3f < (uint)local_268.field_1._24_4_) {
          uVar37 = (ulong)((uint *)CONCAT17(local_268.field_1._15_1_,local_268.field_1._8_7_))[1];
        }
      }
      (**pEVar3->_vptr_ErrorReporter)(pEVar3,uVar41,uVar37,pcVar34,lVar5 + (ulong)(lVar5 == 0));
      if (CONCAT44(uVar49,uVar48) != 0) {
        (*(code *)**(undefined8 **)CONCAT44(uVar59,uVar58))
                  ((undefined8 *)CONCAT44(uVar59,uVar58),CONCAT44(uVar49,uVar48),1,
                   CONCAT44(uVar53,uVar50),CONCAT44(uVar53,uVar50),0);
      }
      goto switchD_001c930a_caseD_0;
    }
    uVar49 = uVar58;
    uVar51 = uVar59;
    uVar54 = uVar33;
    if ((uVar50 != 2) &&
       (uVar49 = auStack_3c0._8_4_, uVar51 = auStack_3c0._12_4_, uVar54 = auStack_3c0._16_4_,
       uVar50 == 1)) {
      auStack_3c0._28_4_ =
           (undefined4)
           (CONCAT26(in_stack_fffffffffffffb6e,
                     CONCAT24(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68)) >> 0x20);
      uVar49 = uVar58;
      uVar51 = uVar59;
      uVar54 = uVar33;
      auStack_3c0._32_7_ = uVar10;
      auStack_3c0[0x27] = uVar11;
      auStack_3c0._40_7_ = uVar13;
      auStack_3c0[0x2f] = uVar15;
    }
    auStack_3c0._16_4_ = uVar54;
    auStack_3c0._12_4_ = uVar51;
    auStack_3c0._8_4_ = uVar49;
    auStack_3c0._0_4_ = uVar50;
    interpretResolve((BrandedDecl *)&stack0xfffffffffffffb48,this,resolver,
                     (ResolveResult *)auStack_3c0,source);
    break;
  case 9:
    pCVar29 = pCVar31;
    pWVar38 = pWVar32;
    pSVar42 = pSVar36;
    local_268.field_1._16_4_ = source._reader.nestingLimit;
    if (source._reader.pointerCount == 0) {
      pCVar29 = (CapTableReader *)0x0;
      pWVar38 = (WirePointer *)0x0;
      pSVar42 = (SegmentReader *)0x0;
      local_268.field_1._16_4_ = 0x7fffffff;
    }
    local_268._0_4_ = SUB84(pSVar42,0);
    local_268._4_4_ = SUB84((ulong)pSVar42 >> 0x20,0);
    local_268.field_1.value.body.tag = (uint)pCVar29;
    local_268.field_1._4_4_ = (undefined4)((ulong)pCVar29 >> 0x20);
    local_268.field_1._8_7_ = SUB87(pWVar38,0);
    local_268.field_1._15_1_ = (undefined1)((ulong)pWVar38 >> 0x38);
    capnp::_::PointerReader::getStruct(&local_60,(PointerReader *)&local_268,(word *)0x0);
    implicitMethodParams_01.params.reader.step = implicitMethodParams.params.reader.step;
    implicitMethodParams_01.params.reader.elementCount =
         implicitMethodParams.params.reader.elementCount;
    source_01._reader.capTable = local_60.capTable;
    source_01._reader.segment = local_60.segment;
    source_01._reader.data = local_60.data;
    source_01._reader.pointers = local_60.pointers;
    source_01._reader.dataSize = local_60.dataSize;
    source_01._reader.pointerCount = local_60.pointerCount;
    source_01._reader._38_2_ = local_60._38_2_;
    source_01._reader.nestingLimit = local_60.nestingLimit;
    source_01._reader._44_4_ = local_60._44_4_;
    implicitMethodParams_01.params.reader.segment = implicitMethodParams.params.reader.segment;
    implicitMethodParams_01.scopeId = implicitMethodParams.scopeId;
    implicitMethodParams_01.params.reader.capTable = implicitMethodParams.params.reader.capTable;
    implicitMethodParams_01.params.reader.ptr = implicitMethodParams.params.reader.ptr;
    implicitMethodParams_01.params.reader.structDataSize =
         implicitMethodParams.params.reader.structDataSize;
    implicitMethodParams_01.params.reader.structPointerCount =
         implicitMethodParams.params.reader.structPointerCount;
    implicitMethodParams_01.params.reader.elementSize =
         implicitMethodParams.params.reader.elementSize;
    implicitMethodParams_01.params.reader._39_1_ = implicitMethodParams.params.reader._39_1_;
    implicitMethodParams_01.params.reader.nestingLimit =
         implicitMethodParams.params.reader.nestingLimit;
    implicitMethodParams_01.params.reader._44_4_ = implicitMethodParams.params.reader._44_4_;
    compileDeclExpression
              ((Maybe<capnp::compiler::NodeTranslator::BrandedDecl> *)local_3c8,this,source_01,
               resolver,implicitMethodParams_01);
    uVar22 = auStack_3c0._160_8_;
    uVar21 = auStack_3c0._152_8_;
    uVar20 = auStack_3c0._144_8_;
    uVar19 = auStack_3c0._136_8_;
    uVar18 = auStack_3c0._128_8_;
    uVar17 = auStack_3c0._120_8_;
    uVar16 = auStack_3c0._112_8_;
    uVar6 = auStack_3c0._104_8_;
    uVar33 = auStack_3c0._0_4_;
    uVar57 = local_3c8._0_4_ & 0xff;
    if (local_3c8[0] != (_)0x1) {
      (__return_storage_ptr__->ptr).isSet = false;
      _Var27 = local_3c8[0];
      goto LAB_001caf3f;
    }
    uVar50 = auStack_3c0._8_4_;
    uVar53 = auStack_3c0._12_4_;
    uVar58 = auStack_3c0._16_4_;
    uVar59 = auStack_3c0._20_4_;
    if ((auStack_3c0._0_4_ != 2) &&
       (uVar50 = in_stack_fffffffffffffb58, uVar53 = in_stack_fffffffffffffb5c,
       uVar58 = in_stack_fffffffffffffb60, uVar59 = in_stack_fffffffffffffb64,
       auStack_3c0._0_4_ == 1)) {
      _local_488 = CONCAT17(auStack_3c0[0x2f],auStack_3c0._40_7_);
      _uStack_490 = CONCAT17(auStack_3c0[0x27],auStack_3c0._32_7_);
      in_stack_fffffffffffffb6c = (undefined2)auStack_3c0._28_4_;
      in_stack_fffffffffffffb6e = SUB42(auStack_3c0._28_4_,2);
      local_480 = auStack_3c0[0x30];
      uVar50 = auStack_3c0._8_4_;
      uVar53 = auStack_3c0._12_4_;
      uVar58 = auStack_3c0._16_4_;
      uVar59 = auStack_3c0._20_4_;
      in_stack_fffffffffffffb68 = auStack_3c0._24_4_;
      if (auStack_3c0[0x30] == 1) {
        uStack_458 = auStack_3c0._88_8_;
        local_450 = auStack_3c0._96_8_;
        uStack_468 = auStack_3c0._72_8_;
        local_460 = auStack_3c0._80_8_;
        uStack_478 = auStack_3c0._56_8_;
        local_470 = auStack_3c0._64_8_;
      }
    }
    pBStack_448 = (BrandScope *)auStack_3c0._104_8_;
    local_440 = (BrandScope *)auStack_3c0._112_8_;
    if (source._reader.pointerCount < 2) {
      auStack_3c0._16_4_ = 0x7fffffff;
      pCVar31 = (CapTableReader *)0x0;
      pWVar32 = (WirePointer *)0x0;
      pSVar36 = (SegmentReader *)0x0;
    }
    else {
      pWVar32 = pWVar32 + 1;
      auStack_3c0._16_4_ = source._reader.nestingLimit;
    }
    local_3c8._0_4_ = SUB84(pSVar36,0);
    local_3c8._4_4_ = (undefined4)((ulong)pSVar36 >> 0x20);
    auStack_3c0._0_4_ = SUB84(pCVar31,0);
    auStack_3c0._4_4_ = (undefined4)((ulong)pCVar31 >> 0x20);
    auStack_3c0._8_4_ = SUB84(pWVar32,0);
    auStack_3c0._12_4_ = (undefined4)((ulong)pWVar32 >> 0x20);
    capnp::_::PointerReader::getList
              (&local_3f8,(PointerReader *)local_3c8,INLINE_COMPOSITE,(word *)0x0);
    pBVar30 = (BrandScope *)(ulong)local_3f8.elementCount;
    pBStack_2d0 = (BrandedDecl *)
                  kj::_::HeapArrayDisposer::allocateImpl
                            (0xa8,0,(size_t)pBVar30,(_func_void_void_ptr *)0x0,
                             (_func_void_void_ptr *)0x0);
    _Var27 = SUB41(uVar57,0);
    local_2c8 = pBStack_2d0 + (long)pBVar30;
    local_2c0 = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    uStack_428 = (undefined4)uVar19;
    uStack_424 = SUB84(uVar19,4);
    local_420 = (StructDataBitCount)uVar20;
    uStack_41c = SUB84(uVar20,4);
    SStack_418 = (StructDataBitCount)uVar21;
    uStack_414 = SUB84(uVar21,4);
    iStack_410 = (int)uVar22;
    uStack_40c = SUB84(uVar22,4);
    pBVar43 = pBStack_2d0;
    if (local_3f8.elementCount == 0) {
LAB_001cab74:
      uVar45 = SUB81(pCVar31,0);
      local_1b8.size_ = ((long)pBStack_2d0 - (long)pBVar43 >> 3) * -0x30c30c30c30c30c3;
      local_2d8 = (BrandedDecl *)0x0;
      pBStack_2d0 = (BrandedDecl *)0x0;
      local_2c8 = (BrandedDecl *)0x0;
      local_1b8.ptr = pBVar43;
      local_1b8.disposer = local_2c0;
      BrandedDecl::applyParams
                ((Maybe<capnp::compiler::NodeTranslator::BrandedDecl> *)local_3c8,
                 (BrandedDecl *)&stack0xfffffffffffffb50,&local_1b8,source);
      sVar25 = local_1b8.size_;
      pBVar43 = local_1b8.ptr;
      bVar46 = (bool)local_3c8[0];
      uVar48 = (uint)pBVar30;
      uVar26 = auStack_3c0._0_4_;
      if (local_3c8[0] == (_)0x1) {
        if (auStack_3c0._0_4_ == 2) {
          local_2a8.content.ptr._4_4_ = auStack_3c0._8_4_;
          local_2a8.content.size_._0_4_ = auStack_3c0._12_4_;
          local_2a8.content.size_._4_4_ = auStack_3c0._16_4_;
          local_2a8.content.disposer._0_4_ = auStack_3c0._20_4_;
        }
        else if (auStack_3c0._0_4_ == 1) {
          uStack_284 = (undefined4)auStack_3c0._40_7_;
          uStack_280 = (undefined4)(CONCAT17(auStack_3c0[0x2f],auStack_3c0._40_7_) >> 0x20);
          local_2a8.content.disposer._4_4_ = auStack_3c0._24_4_;
          uStack_290 = auStack_3c0._28_4_;
          uStack_28c = (undefined4)auStack_3c0._32_7_;
          local_288 = (undefined4)(CONCAT17(auStack_3c0[0x27],auStack_3c0._32_7_) >> 0x20);
          local_2a8.content.ptr._4_4_ = auStack_3c0._8_4_;
          local_2a8.content.size_._0_4_ = auStack_3c0._12_4_;
          local_2a8.content.size_._4_4_ = auStack_3c0._16_4_;
          local_2a8.content.disposer._0_4_ = auStack_3c0._20_4_;
          uVar45 = auStack_3c0[0x30];
          if (auStack_3c0[0x30] == 1) {
            local_268.field_1._31_1_ = (undefined1)auStack_3c0._88_8_;
            local_268.field_1._32_4_ = SUB84(auStack_3c0._88_8_,1);
            local_268.field_1._36_3_ = SUB83(auStack_3c0._88_8_,5);
            local_268.field_1._39_1_ = (undefined1)auStack_3c0._96_8_;
            local_268.field_1._40_7_ = SUB87(auStack_3c0._96_8_,1);
            local_268.field_1._15_1_ = (undefined1)auStack_3c0._72_8_;
            local_268.field_1._16_4_ = SUB84(auStack_3c0._72_8_,1);
            local_268.field_1._20_3_ = SUB83(auStack_3c0._72_8_,5);
            local_268.field_1._23_1_ = (undefined1)auStack_3c0._80_8_;
            local_268.field_1._24_4_ = SUB84(auStack_3c0._80_8_,1);
            local_268.field_1._28_2_ = SUB82(auStack_3c0._80_8_,5);
            local_268.field_1._30_1_ = SUB81(auStack_3c0._80_8_,7);
            local_268._7_1_ = SUB81(auStack_3c0._56_8_,0);
            local_268.field_1.value.body.tag = SUB84(auStack_3c0._56_8_,1);
            local_268.field_1._4_3_ = SUB83(auStack_3c0._56_8_,5);
            local_268.field_1._7_1_ = (undefined1)auStack_3c0._64_8_;
            local_268.field_1._8_7_ = SUB87(auStack_3c0._64_8_,1);
          }
        }
        local_318 = (BrandScope *)auStack_3c0._104_8_;
        pBStack_310 = (BrandScope *)auStack_3c0._112_8_;
        auStack_3c0._112_8_ = (BrandScope *)0x0;
        local_308._0_8_ = auStack_3c0._120_8_;
        stack0xfffffffffffffd00 = (CapTableReader *)auStack_3c0._128_8_;
        local_2f8 = (WirePointer *)auStack_3c0._136_8_;
        pWStack_2f0 = (WirePointer *)auStack_3c0._144_8_;
        local_2e8 = auStack_3c0._152_4_;
        SStack_2e4 = auStack_3c0._156_2_;
        uStack_2e2 = auStack_3c0._158_2_;
        _iStack_2e0 = auStack_3c0._160_8_;
        uVar48 = auStack_3c0._0_4_;
        uVar26 = 0;
        if (1 < auStack_3c0._0_4_ - 1) {
          uVar26 = auStack_3c0._0_4_;
        }
      }
      auStack_3c0._0_4_ = uVar26;
      if (local_1b8.ptr != (BrandedDecl *)0x0) {
        local_1b8.ptr = (BrandedDecl *)0x0;
        local_1b8.size_ = 0;
        (**(local_1b8.disposer)->_vptr_ArrayDisposer)
                  (local_1b8.disposer,pBVar43,0xa8,sVar25,sVar25,
                   kj::ArrayDisposer::Dispose_<capnp::compiler::NodeTranslator::BrandedDecl,_false>
                   ::destruct);
      }
      (__return_storage_ptr__->ptr).isSet = true;
      if (bVar46 == false) {
        (__return_storage_ptr__->ptr).field_1.value.body.tag = uVar33;
        if (uVar33 == 2) {
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = CONCAT44(uVar53,uVar50);
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) = CONCAT44(uVar59,uVar58);
        }
        else if (uVar33 == 1) {
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28) = _local_488;
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x18) =
               CONCAT26(in_stack_fffffffffffffb6e,
                        CONCAT24(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) = _uStack_490;
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = CONCAT44(uVar53,uVar50);
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) = CONCAT44(uVar59,uVar58);
          *(undefined1 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x30) = local_480;
          if (local_480 == 1) {
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x58) = uStack_458;
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x60) = local_450;
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x48) = uStack_468;
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x50) = local_460;
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x38) = uStack_478;
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x40) = local_470;
          }
        }
        (__return_storage_ptr__->ptr).field_1.value.brand.disposer = (Disposer *)uVar6;
        (__return_storage_ptr__->ptr).field_1.value.brand.ptr = (BrandScope *)uVar16;
        local_440 = (BrandScope *)0x0;
        *(StructDataBitCount *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x98) = SStack_418;
        *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x9c) = uStack_414;
        *(int *)((long)&(__return_storage_ptr__->ptr).field_1 + 0xa0) = iStack_410;
        *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0xa4) = uStack_40c;
        *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x88) = uStack_428;
        *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x8c) = uStack_424;
        *(StructDataBitCount *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x90) = local_420;
        *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x94) = uStack_41c;
        (__return_storage_ptr__->ptr).field_1.value.source._reader.segment = (SegmentReader *)uVar17
        ;
        (__return_storage_ptr__->ptr).field_1.value.source._reader.capTable =
             (CapTableReader *)uVar18;
      }
      else {
        (__return_storage_ptr__->ptr).field_1.value.body.tag = uVar48;
        if (uVar48 == 2) {
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
               CONCAT44((undefined4)local_2a8.content.size_,local_2a8.content.ptr._4_4_);
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
               CONCAT44(local_2a8.content.disposer._0_4_,local_2a8.content.size_._4_4_);
        }
        else if (uVar48 == 1) {
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28) =
               CONCAT44(uStack_280,uStack_284);
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x18) =
               CONCAT44(uStack_290,local_2a8.content.disposer._4_4_);
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) =
               CONCAT44(local_288,uStack_28c);
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
               CONCAT44((undefined4)local_2a8.content.size_,local_2a8.content.ptr._4_4_);
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
               CONCAT44(local_2a8.content.disposer._0_4_,local_2a8.content.size_._4_4_);
          *(undefined1 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x30) = uVar45;
          if ((uVar45 & 1) != 0) {
            *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x58) =
                 CONCAT35(local_268.field_1._36_3_,
                          CONCAT41(local_268.field_1._32_4_,local_268.field_1._31_1_));
            *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x60) =
                 CONCAT71(local_268.field_1._40_7_,local_268.field_1._39_1_);
            *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x48) =
                 CONCAT35(local_268.field_1._20_3_,
                          CONCAT41(local_268.field_1._16_4_,local_268.field_1._15_1_));
            *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x50) =
                 CONCAT17(local_268.field_1._30_1_,
                          CONCAT25(local_268.field_1._28_2_,
                                   CONCAT41(local_268.field_1._24_4_,local_268.field_1._23_1_)));
            *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x38) =
                 CONCAT35(local_268.field_1._4_3_,
                          CONCAT41(local_268.field_1.value.body.tag,local_268._7_1_));
            *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x40) =
                 CONCAT71(local_268.field_1._8_7_,local_268.field_1._7_1_);
          }
        }
        (__return_storage_ptr__->ptr).field_1.value.brand.disposer = (Disposer *)local_318;
        (__return_storage_ptr__->ptr).field_1.value.brand.ptr = pBStack_310;
        (__return_storage_ptr__->ptr).field_1.value.source._reader.segment =
             (SegmentReader *)local_308._0_8_;
        (__return_storage_ptr__->ptr).field_1.value.source._reader.capTable =
             stack0xfffffffffffffd00;
        *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x88) = (undefined4)local_2f8
        ;
        *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x8c) = local_2f8._4_4_;
        *(int *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x90) = (int)pWStack_2f0;
        *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x94) = pWStack_2f0._4_4_;
        *(uint *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x98) = local_2e8;
        *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x9c) = _SStack_2e4;
        *(int *)((long)&(__return_storage_ptr__->ptr).field_1 + 0xa0) = iStack_2e0;
        *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0xa4) = uStack_2dc;
      }
    }
    else {
      bVar46 = false;
      EVar40 = 0;
      pRVar56 = resolver;
      local_2d8 = pBStack_2d0;
      do {
        while( true ) {
          EVar44 = EVar40 + 1;
          capnp::_::ListReader::getStructElement((StructReader *)local_308,&local_3f8,EVar40);
          if ((0xf < local_2e8) && ((short)(local_2f8->offsetAndKind).value == 1)) {
            bVar47 = SStack_2e4 == 0;
            pWVar32 = pWStack_2f0;
            if (bVar47) {
              pWVar32 = (WirePointer *)0x0;
            }
            local_268.field_1._16_4_ = iStack_2e0;
            if (bVar47) {
              local_268.field_1._16_4_ = 0x7fffffff;
            }
            local_268.isSet = false;
            local_268._1_3_ = 0;
            local_268._4_4_ = 0;
            local_268.field_1.value.body.tag = 0;
            local_268.field_1._4_4_ = 0;
            if (!bVar47) {
              local_268._0_4_ = local_308._0_4_;
              local_268._4_4_ = local_308._4_4_;
              local_268.field_1.value.body.tag = local_308._8_4_;
              local_268.field_1._4_4_ = uStack_2fc;
            }
            pEVar3 = this->errorReporter;
            local_268.field_1._8_7_ = SUB87(pWVar32,0);
            local_268.field_1._15_1_ = (undefined1)((ulong)pWVar32 >> 0x38);
            capnp::_::PointerReader::getStruct
                      ((StructReader *)local_3c8,(PointerReader *)&local_268,(word *)0x0);
            uVar37 = 0;
            if ((uint)auStack_3c0._24_4_ < 0x20) {
              uVar41 = 0;
            }
            else {
              uVar41 = (ulong)*(uint *)CONCAT44(auStack_3c0._12_4_,auStack_3c0._8_4_);
              if (0x3f < (uint)auStack_3c0._24_4_) {
                uVar37 = (ulong)((uint *)CONCAT44(auStack_3c0._12_4_,auStack_3c0._8_4_))[1];
              }
            }
            resolver = pRVar56;
            (**pEVar3->_vptr_ErrorReporter)
                      (pEVar3,uVar41,uVar37,"Named parameter not allowed here.",0x22);
            pRVar56 = resolver;
          }
          local_148.pointer = pWStack_2f0 + 1;
          if (SStack_2e4 < 2) {
            local_148.pointer = (WirePointer *)0x0;
          }
          if (SStack_2e4 < 2) {
            local_148.segment._0_4_ = 0;
            local_148.segment._4_4_ = 0;
            local_148.capTable._0_4_ = 0;
            local_148.capTable._4_4_ = 0;
            local_148.nestingLimit = 0x7fffffff;
          }
          else {
            local_148.segment._0_4_ = local_308._0_4_;
            local_148.segment._4_4_ = local_308._4_4_;
            local_148.capTable._0_4_ = local_308._8_4_;
            local_148.capTable._4_4_ = uStack_2fc;
            local_148.nestingLimit = iStack_2e0;
          }
          capnp::_::PointerReader::getStruct(&local_c0,&local_148,(word *)0x0);
          implicitMethodParams_02.params.reader.step = implicitMethodParams.params.reader.step;
          implicitMethodParams_02.params.reader.elementCount =
               implicitMethodParams.params.reader.elementCount;
          source_02._reader.capTable = local_c0.capTable;
          source_02._reader.segment = local_c0.segment;
          source_02._reader.data = local_c0.data;
          source_02._reader.pointers = local_c0.pointers;
          source_02._reader.dataSize = local_c0.dataSize;
          source_02._reader.pointerCount = local_c0.pointerCount;
          source_02._reader._38_2_ = local_c0._38_2_;
          source_02._reader.nestingLimit = local_c0.nestingLimit;
          source_02._reader._44_4_ = local_c0._44_4_;
          implicitMethodParams_02.params.reader.segment = implicitMethodParams.params.reader.segment
          ;
          implicitMethodParams_02.scopeId = implicitMethodParams.scopeId;
          implicitMethodParams_02.params.reader.capTable =
               implicitMethodParams.params.reader.capTable;
          implicitMethodParams_02.params.reader.ptr = implicitMethodParams.params.reader.ptr;
          implicitMethodParams_02.params.reader.structDataSize =
               implicitMethodParams.params.reader.structDataSize;
          implicitMethodParams_02.params.reader.structPointerCount =
               implicitMethodParams.params.reader.structPointerCount;
          implicitMethodParams_02.params.reader.elementSize =
               implicitMethodParams.params.reader.elementSize;
          implicitMethodParams_02.params.reader._39_1_ = implicitMethodParams.params.reader._39_1_;
          implicitMethodParams_02.params.reader.nestingLimit =
               implicitMethodParams.params.reader.nestingLimit;
          implicitMethodParams_02.params.reader._44_4_ = implicitMethodParams.params.reader._44_4_;
          compileDeclExpression
                    ((Maybe<capnp::compiler::NodeTranslator::BrandedDecl> *)local_3c8,this,source_02
                     ,resolver,implicitMethodParams_02);
          _Var27 = SUB41(uVar57,0);
          EVar40 = EVar44;
          if (local_3c8[0] == (_)0x1) break;
          bVar46 = true;
          if (EVar44 == local_3f8.elementCount) goto LAB_001ca643;
        }
        if (auStack_3c0._0_4_ == 2) {
          ppvVar35 = &local_118;
          iVar28 = auStack_3c0._8_4_;
          uVar49 = auStack_3c0._12_4_;
          iVar52 = auStack_3c0._16_4_;
          uVar51 = auStack_3c0._20_4_;
LAB_001ca545:
          *(int *)ppvVar35 = iVar28;
          *(undefined4 *)((long)ppvVar35 + 4) = uVar49;
          *(int *)(ppvVar35 + 1) = iVar52;
          *(undefined4 *)((long)ppvVar35 + 0xc) = uVar51;
        }
        else if (auStack_3c0._0_4_ == 1) {
          local_f8 = CONCAT17(auStack_3c0[0x2f],auStack_3c0._40_7_);
          local_118 = (void *)CONCAT44(auStack_3c0._12_4_,auStack_3c0._8_4_);
          uStack_110 = CONCAT44(auStack_3c0._20_4_,auStack_3c0._16_4_);
          local_108 = CONCAT44(auStack_3c0._28_4_,auStack_3c0._24_4_);
          uStack_100 = CONCAT17(auStack_3c0[0x27],auStack_3c0._32_7_);
          local_318 = (BrandScope *)CONCAT71(local_318._1_7_,auStack_3c0[0x30]);
          if (auStack_3c0[0x30] == 1) {
            ppvVar35 = (void **)&local_268.field_0x7;
            local_268.field_1._31_1_ = (undefined1)auStack_3c0._88_8_;
            local_268.field_1._32_4_ = SUB84(auStack_3c0._88_8_,1);
            local_268.field_1._36_3_ = SUB83(auStack_3c0._88_8_,5);
            local_268.field_1._39_1_ = (undefined1)auStack_3c0._96_8_;
            local_268.field_1._40_7_ = SUB87(auStack_3c0._96_8_,1);
            local_268.field_1._15_1_ = (undefined1)auStack_3c0._72_8_;
            local_268.field_1._16_4_ = SUB84(auStack_3c0._72_8_,1);
            local_268.field_1._20_3_ = SUB83(auStack_3c0._72_8_,5);
            local_268.field_1._23_1_ = (undefined1)auStack_3c0._80_8_;
            local_268.field_1._24_4_ = SUB84(auStack_3c0._80_8_,1);
            local_268.field_1._28_2_ = SUB82(auStack_3c0._80_8_,5);
            local_268.field_1._30_1_ = SUB81(auStack_3c0._80_8_,7);
            iVar28 = auStack_3c0._56_4_;
            uVar49 = auStack_3c0._60_4_;
            iVar52 = auStack_3c0._64_4_;
            uVar51 = auStack_3c0._68_4_;
            goto LAB_001ca545;
          }
        }
        local_2a8.content.ptr._0_4_ = (undefined4)auStack_3c0._120_8_;
        local_2a8.content.ptr._4_4_ = SUB84(auStack_3c0._120_8_,4);
        local_2a8.content.size_._0_4_ = (undefined4)auStack_3c0._128_8_;
        local_2a8.content.size_._4_4_ = SUB84(auStack_3c0._128_8_,4);
        local_2a8.content.disposer._0_4_ = (undefined4)auStack_3c0._136_8_;
        local_2a8.content.disposer._4_4_ = SUB84(auStack_3c0._136_8_,4);
        uStack_290 = (undefined4)auStack_3c0._144_8_;
        uStack_28c = SUB84(auStack_3c0._144_8_,4);
        local_288 = (undefined4)auStack_3c0._152_8_;
        uStack_284 = SUB84(auStack_3c0._152_8_,4);
        uStack_280 = (undefined4)auStack_3c0._160_8_;
        uStack_27c = SUB84(auStack_3c0._160_8_,4);
        (pBStack_2d0->body).tag = auStack_3c0._0_4_;
        if (auStack_3c0._0_4_ - 1 < 2) {
          paVar2 = &(pBStack_2d0->body).field_1;
          if (auStack_3c0._0_4_ == 1) {
            *(undefined8 *)((long)&(pBStack_2d0->body).field_1 + 0x20) = local_f8;
            *(undefined8 *)((long)&(pBStack_2d0->body).field_1 + 0x10) = local_108;
            *(undefined8 *)((long)&(pBStack_2d0->body).field_1 + 0x18) = uStack_100;
            paVar2->forceAligned = local_118;
            *(undefined8 *)((long)&(pBStack_2d0->body).field_1 + 8) = uStack_110;
            (pBStack_2d0->body).field_1.space[0x28] = (byte)local_318;
            if (((ulong)local_318 & 1) != 0) {
              *(ulong *)((long)&(pBStack_2d0->body).field_1 + 0x50) =
                   CONCAT35(local_268.field_1._36_3_,
                            CONCAT41(local_268.field_1._32_4_,local_268.field_1._31_1_));
              *(ulong *)((long)&(pBStack_2d0->body).field_1 + 0x58) =
                   CONCAT71(local_268.field_1._40_7_,local_268.field_1._39_1_);
              *(ulong *)((long)&(pBStack_2d0->body).field_1 + 0x40) =
                   CONCAT35(local_268.field_1._20_3_,
                            CONCAT41(local_268.field_1._16_4_,local_268.field_1._15_1_));
              *(ulong *)((long)&(pBStack_2d0->body).field_1 + 0x48) =
                   CONCAT17(local_268.field_1._30_1_,
                            CONCAT25(local_268.field_1._28_2_,
                                     CONCAT41(local_268.field_1._24_4_,local_268.field_1._23_1_)));
              *(ulong *)((long)&(pBStack_2d0->body).field_1 + 0x30) =
                   CONCAT35(local_268.field_1._4_3_,
                            CONCAT41(local_268.field_1.value.body.tag,local_268._7_1_));
              *(ulong *)((long)&(pBStack_2d0->body).field_1 + 0x38) =
                   CONCAT71(local_268.field_1._8_7_,local_268.field_1._7_1_);
            }
          }
          else {
            paVar2->forceAligned = local_118;
            *(undefined8 *)((long)&(pBStack_2d0->body).field_1 + 8) = uStack_110;
          }
        }
        (pBStack_2d0->brand).disposer = (Disposer *)auStack_3c0._104_8_;
        (pBStack_2d0->brand).ptr = (BrandScope *)auStack_3c0._112_8_;
        (pBStack_2d0->source)._reader.segment = (SegmentReader *)auStack_3c0._120_8_;
        (pBStack_2d0->source)._reader.capTable = (CapTableReader *)auStack_3c0._128_8_;
        (pBStack_2d0->source)._reader.data = (void *)auStack_3c0._136_8_;
        (pBStack_2d0->source)._reader.pointers = (WirePointer *)auStack_3c0._144_8_;
        (pBStack_2d0->source)._reader.dataSize = auStack_3c0._152_4_;
        (pBStack_2d0->source)._reader.pointerCount = auStack_3c0._156_2_;
        *(undefined2 *)&(pBStack_2d0->source)._reader.field_0x26 = auStack_3c0._158_2_;
        *(undefined8 *)&(pBStack_2d0->source)._reader.nestingLimit = auStack_3c0._160_8_;
        pBStack_2d0 = pBStack_2d0 + 1;
      } while (EVar44 != local_3f8.elementCount);
      if (!bVar46) {
        pCVar31 = (CapTableReader *)0x0;
        pBVar30 = this;
        pBVar43 = local_2d8;
        goto LAB_001cab74;
      }
LAB_001ca643:
      (__return_storage_ptr__->ptr).isSet = true;
      (__return_storage_ptr__->ptr).field_1.value.body.tag = uVar33;
      if (uVar33 == 2) {
        *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = CONCAT44(uVar53,uVar50);
        *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) = CONCAT44(uVar59,uVar58);
      }
      else if (uVar33 == 1) {
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28) = _local_488;
        *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x18) =
             CONCAT26(in_stack_fffffffffffffb6e,
                      CONCAT24(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) = _uStack_490;
        *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = CONCAT44(uVar53,uVar50);
        *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) = CONCAT44(uVar59,uVar58);
        *(undefined1 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x30) = local_480;
        if (local_480 == 1) {
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x58) = uStack_458;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x60) = local_450;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x48) = uStack_468;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x50) = local_460;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x38) = uStack_478;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x40) = local_470;
        }
      }
      (__return_storage_ptr__->ptr).field_1.value.brand.disposer = (Disposer *)uVar6;
      (__return_storage_ptr__->ptr).field_1.value.brand.ptr = (BrandScope *)uVar16;
      local_440 = (BrandScope *)0x0;
      *(StructDataBitCount *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x98) = SStack_418;
      *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x9c) = uStack_414;
      *(int *)((long)&(__return_storage_ptr__->ptr).field_1 + 0xa0) = iStack_410;
      *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0xa4) = uStack_40c;
      *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x88) = uStack_428;
      *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x8c) = uStack_424;
      *(StructDataBitCount *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x90) = local_420;
      *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x94) = uStack_41c;
      (__return_storage_ptr__->ptr).field_1.value.source._reader.segment = (SegmentReader *)uVar17;
      (__return_storage_ptr__->ptr).field_1.value.source._reader.capTable = (CapTableReader *)uVar18
      ;
    }
    pBVar24 = local_2c8;
    pBVar23 = pBStack_2d0;
    pBVar43 = local_2d8;
    if (local_2d8 != (BrandedDecl *)0x0) {
      local_2d8 = (BrandedDecl *)0x0;
      pBStack_2d0 = (BrandedDecl *)0x0;
      local_2c8 = (BrandedDecl *)0x0;
      (**local_2c0->_vptr_ArrayDisposer)
                (local_2c0,pBVar43,0xa8,((long)pBVar23 - (long)pBVar43 >> 3) * -0x30c30c30c30c30c3,
                 ((long)pBVar24 - (long)pBVar43 >> 3) * -0x30c30c30c30c30c3,
                 kj::ArrayDisposer::Dispose_<capnp::compiler::NodeTranslator::BrandedDecl,_false>::
                 destruct);
    }
LAB_001caf3f:
    if (((byte)_Var27 & 1) == 0) {
      return __return_storage_ptr__;
    }
    if (local_440 == (BrandScope *)0x0) {
      return __return_storage_ptr__;
    }
    (**(pBStack_448->super_Refcounted).super_Disposer._vptr_Disposer)
              (pBStack_448,
               (_func_int *)
               ((long)&(local_440->super_Refcounted).super_Disposer._vptr_Disposer +
               (long)(local_440->super_Refcounted).super_Disposer._vptr_Disposer[-2]));
    return __return_storage_ptr__;
  case 10:
    local_2ac = source._reader.nestingLimit;
    pCVar29 = pCVar31;
    pWVar38 = pWVar32;
    pSVar42 = pSVar36;
    local_268.field_1._16_4_ = source._reader.nestingLimit;
    if (source._reader.pointerCount == 0) {
      local_268.field_1._16_4_ = 0x7fffffff;
      pCVar29 = (CapTableReader *)0x0;
      pWVar38 = (WirePointer *)0x0;
      pSVar42 = (SegmentReader *)0x0;
    }
    local_268._0_4_ = SUB84(pSVar42,0);
    local_268._4_4_ = SUB84((ulong)pSVar42 >> 0x20,0);
    local_268.field_1.value.body.tag = (uint)pCVar29;
    local_268.field_1._4_4_ = (undefined4)((ulong)pCVar29 >> 0x20);
    local_268.field_1._8_7_ = SUB87(pWVar38,0);
    local_268.field_1._15_1_ = (undefined1)((ulong)pWVar38 >> 0x38);
    local_318 = (BrandScope *)pWVar32;
    local_270 = pCVar31;
    capnp::_::PointerReader::getStruct(&local_90,(PointerReader *)&local_268,(word *)0x0);
    implicitMethodParams_00.params.reader.step = implicitMethodParams.params.reader.step;
    implicitMethodParams_00.params.reader.elementCount =
         implicitMethodParams.params.reader.elementCount;
    source_00._reader.capTable = local_90.capTable;
    source_00._reader.segment = local_90.segment;
    source_00._reader.data = local_90.data;
    source_00._reader.pointers = local_90.pointers;
    source_00._reader.dataSize = local_90.dataSize;
    source_00._reader.pointerCount = local_90.pointerCount;
    source_00._reader._38_2_ = local_90._38_2_;
    source_00._reader.nestingLimit = local_90.nestingLimit;
    source_00._reader._44_4_ = local_90._44_4_;
    implicitMethodParams_00.params.reader.segment = implicitMethodParams.params.reader.segment;
    implicitMethodParams_00.scopeId = implicitMethodParams.scopeId;
    implicitMethodParams_00.params.reader.capTable = implicitMethodParams.params.reader.capTable;
    implicitMethodParams_00.params.reader.ptr = implicitMethodParams.params.reader.ptr;
    implicitMethodParams_00.params.reader.structDataSize =
         implicitMethodParams.params.reader.structDataSize;
    implicitMethodParams_00.params.reader.structPointerCount =
         implicitMethodParams.params.reader.structPointerCount;
    implicitMethodParams_00.params.reader.elementSize =
         implicitMethodParams.params.reader.elementSize;
    implicitMethodParams_00.params.reader._39_1_ = implicitMethodParams.params.reader._39_1_;
    implicitMethodParams_00.params.reader.nestingLimit =
         implicitMethodParams.params.reader.nestingLimit;
    implicitMethodParams_00.params.reader._44_4_ = implicitMethodParams.params.reader._44_4_;
    compileDeclExpression
              ((Maybe<capnp::compiler::NodeTranslator::BrandedDecl> *)local_3c8,this,source_00,
               resolver,implicitMethodParams_00);
    iVar28 = local_2ac;
    pBVar30 = local_318;
    uVar33 = auStack_3c0._0_4_;
    uVar48 = CONCAT31((int3)(in_stack_fffffffffffffb48 >> 8),local_3c8[0]);
    if (local_3c8[0] == (_)0x1) {
      uVar50 = auStack_3c0._8_4_;
      uVar53 = auStack_3c0._12_4_;
      uVar58 = auStack_3c0._16_4_;
      uVar59 = auStack_3c0._20_4_;
      if ((auStack_3c0._0_4_ != 2) &&
         (uVar50 = in_stack_fffffffffffffb58, uVar53 = in_stack_fffffffffffffb5c,
         uVar58 = in_stack_fffffffffffffb60, uVar59 = in_stack_fffffffffffffb64,
         auStack_3c0._0_4_ == 1)) {
        in_stack_fffffffffffffb6c = (undefined2)auStack_3c0._28_4_;
        in_stack_fffffffffffffb6e = SUB42(auStack_3c0._28_4_,2);
        uVar50 = auStack_3c0._8_4_;
        uVar53 = auStack_3c0._12_4_;
        uVar58 = auStack_3c0._16_4_;
        uVar59 = auStack_3c0._20_4_;
        in_stack_fffffffffffffb68 = auStack_3c0._24_4_;
      }
      pBStack_448 = (BrandScope *)auStack_3c0._104_8_;
      local_440 = (BrandScope *)auStack_3c0._112_8_;
      if (source._reader.pointerCount < 2) {
        auStack_3c0._16_4_ = 0x7fffffff;
        pCVar31 = (CapTableReader *)0x0;
        pWVar32 = (WirePointer *)0x0;
        pSVar42 = (SegmentReader *)0x0;
      }
      else {
        pWVar32 = (WirePointer *)((long)local_318 + 8);
        pCVar31 = local_270;
        pSVar42 = pSVar36;
        auStack_3c0._16_4_ = local_2ac;
      }
      local_3c8._0_4_ = SUB84(pSVar42,0);
      local_3c8._4_4_ = (undefined4)((ulong)pSVar42 >> 0x20);
      auStack_3c0._0_4_ = SUB84(pCVar31,0);
      auStack_3c0._4_4_ = (undefined4)((ulong)pCVar31 >> 0x20);
      auStack_3c0._8_4_ = SUB84(pWVar32,0);
      auStack_3c0._12_4_ = (undefined4)((ulong)pWVar32 >> 0x20);
      pSVar42 = pSVar36;
      capnp::_::PointerReader::getStruct
                ((StructReader *)&local_3f8,(PointerReader *)local_3c8,(word *)0x0);
      bVar46 = local_3f8.structPointerCount == 0;
      local_2f8 = (WirePointer *)CONCAT44(local_3f8.step,local_3f8.elementCount);
      if (bVar46) {
        local_2f8 = (WirePointer *)0x0;
      }
      iVar52 = 0x7fffffff;
      if (!bVar46) {
        iVar52 = local_3f8.nestingLimit;
      }
      local_308._0_4_ = 0;
      local_308._4_4_ = 0;
      uVar49 = 0;
      uVar51 = 0;
      if (!bVar46) {
        local_308._0_4_ = local_3f8.segment._0_4_;
        local_308._4_4_ = local_3f8.segment._4_4_;
        uVar49 = local_3f8.capTable._0_4_;
        uVar51 = local_3f8.capTable._4_4_;
      }
      stack0xfffffffffffffd00 = (CapTableReader *)CONCAT44(uVar51,uVar49);
      pWStack_2f0 = (WirePointer *)CONCAT44(pWStack_2f0._4_4_,iVar52);
      memberName.content =
           (ArrayPtr<const_char>)
           capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)local_308,(void *)0x0,0);
      BrandedDecl::getMember
                ((Maybe<capnp::compiler::NodeTranslator::BrandedDecl> *)&local_268,
                 (BrandedDecl *)&stack0xfffffffffffffb50,memberName,source);
      uVar49 = auStack_3c0._8_4_;
      local_3c8[0] = (_)local_268.isSet;
      if (local_268.isSet == true) {
        auStack_3c0._0_4_ = local_268.field_1.value.body.tag;
        auStack_3c0._8_4_ = (undefined4)local_268.field_1._8_7_;
        if (local_268.field_1.value.body.tag == 2) {
          auStack_3c0._12_4_ =
               (undefined4)(CONCAT17(local_268.field_1._15_1_,local_268.field_1._8_7_) >> 0x20);
          auStack_3c0._16_4_ = local_268.field_1._16_4_;
          auStack_3c0._20_4_ = local_268.field_1._20_4_;
          uVar49 = auStack_3c0._8_4_;
        }
        else if (local_268.field_1.value.body.tag == 1) {
          auStack_3c0._40_7_ = local_268.field_1._40_7_;
          auStack_3c0[0x2f] = local_268.field_1._47_1_;
          auStack_3c0._24_4_ = local_268.field_1._24_4_;
          auStack_3c0._28_4_ =
               (undefined4)
               (CONCAT17(local_268.field_1._31_1_,
                         CONCAT16(local_268.field_1._30_1_,
                                  CONCAT24(local_268.field_1._28_2_,local_268.field_1._24_4_))) >>
               0x20);
          auStack_3c0._32_7_ =
               (undefined7)CONCAT44(local_268.field_1._36_4_,local_268.field_1._32_4_);
          auStack_3c0[0x27] = (undefined1)((uint)local_268.field_1._36_4_ >> 0x18);
          auStack_3c0._12_4_ =
               (undefined4)(CONCAT17(local_268.field_1._15_1_,local_268.field_1._8_7_) >> 0x20);
          auStack_3c0._16_4_ = local_268.field_1._16_4_;
          auStack_3c0._20_4_ = local_268.field_1._20_4_;
          auStack_3c0[0x30] = local_268.field_1._48_1_;
          uVar49 = auStack_3c0._8_4_;
          if (local_268.field_1._48_1_ == 1) {
            auStack_3c0._88_8_ = local_268.field_1._88_8_;
            auStack_3c0._96_8_ = local_268.field_1._96_8_;
            auStack_3c0._72_8_ = local_268.field_1._72_8_;
            auStack_3c0._80_8_ = local_268.field_1._80_8_;
            auStack_3c0._56_8_ = local_268.field_1._56_8_;
            auStack_3c0._64_8_ = local_268.field_1._64_8_;
          }
        }
        auStack_3c0._8_4_ = uVar49;
        auStack_3c0._104_8_ = local_268.field_1.value.brand.disposer;
        auStack_3c0._120_8_ = local_268.field_1.value.source._reader.segment;
        auStack_3c0._128_8_ = local_268.field_1.value.source._reader.capTable;
        auStack_3c0._136_8_ = local_268.field_1.value.source._reader.data;
        auStack_3c0._144_8_ = local_268.field_1.value.source._reader.pointers;
        auStack_3c0._152_8_ = local_268.field_1._152_8_;
        auStack_3c0._160_8_ = local_268.field_1._160_8_;
        (__return_storage_ptr__->ptr).isSet = true;
        (__return_storage_ptr__->ptr).field_1.value.body.tag = local_268.field_1.value.body.tag;
        if (local_268.field_1.value.body.tag == 2) {
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
               CONCAT44(auStack_3c0._12_4_,auStack_3c0._8_4_);
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
               CONCAT44(auStack_3c0._20_4_,auStack_3c0._16_4_);
        }
        else if (local_268.field_1.value.body.tag == 1) {
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28) =
               CONCAT17(auStack_3c0[0x2f],auStack_3c0._40_7_);
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x18) =
               CONCAT44(auStack_3c0._28_4_,auStack_3c0._24_4_);
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) =
               CONCAT17(auStack_3c0[0x27],auStack_3c0._32_7_);
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
               CONCAT44(auStack_3c0._12_4_,auStack_3c0._8_4_);
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
               CONCAT44(auStack_3c0._20_4_,auStack_3c0._16_4_);
          *(undefined1 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x30) = auStack_3c0[0x30];
          if (auStack_3c0[0x30] == 1) {
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x58) =
                 auStack_3c0._88_8_;
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x60) =
                 auStack_3c0._96_8_;
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x48) =
                 auStack_3c0._72_8_;
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x50) =
                 auStack_3c0._80_8_;
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x38) =
                 auStack_3c0._56_8_;
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x40) =
                 auStack_3c0._64_8_;
          }
        }
        (__return_storage_ptr__->ptr).field_1.value.brand.disposer =
             local_268.field_1.value.brand.disposer;
        (__return_storage_ptr__->ptr).field_1.value.brand.ptr = local_268.field_1.value.brand.ptr;
        auStack_3c0._112_8_ = (BrandScope *)0x0;
        pNVar8 = &__return_storage_ptr__->ptr;
        *(undefined4 *)((long)&pNVar8->field_1 + 0x98) = local_268.field_1._152_4_;
        *(undefined2 *)((long)&pNVar8->field_1 + 0x9c) =
             local_268.field_1.value.source._reader.pointerCount;
        *(undefined2 *)((long)&pNVar8->field_1 + 0x9e) = local_268.field_1._158_2_;
        *(undefined8 *)&(__return_storage_ptr__->ptr).field_1.value.source._reader.nestingLimit =
             local_268.field_1._160_8_;
        (__return_storage_ptr__->ptr).field_1.value.source._reader.data =
             local_268.field_1.value.source._reader.data;
        (__return_storage_ptr__->ptr).field_1.value.source._reader.pointers =
             local_268.field_1.value.source._reader.pointers;
        (__return_storage_ptr__->ptr).field_1.value.source._reader.segment =
             local_268.field_1.value.source._reader.segment;
        (__return_storage_ptr__->ptr).field_1.value.source._reader.capTable =
             local_268.field_1.value.source._reader.capTable;
      }
      else {
        pCVar31 = local_270;
        if (source._reader.pointerCount == 0) {
          iVar28 = 0x7fffffff;
          pBVar30 = (BrandScope *)0x0;
          pSVar36 = (SegmentReader *)0x0;
          pCVar31 = (CapTableReader *)0x0;
        }
        pEVar3 = this->errorReporter;
        local_268._0_4_ = SUB84(pSVar36,0);
        local_268._4_4_ = SUB84((ulong)pSVar36 >> 0x20,0);
        local_268.field_1.value.body.tag = (uint)pCVar31;
        local_268.field_1._4_4_ = (undefined4)((ulong)pCVar31 >> 0x20);
        local_268.field_1._8_7_ = SUB87(pBVar30,0);
        local_268.field_1._15_1_ = (undefined1)((ulong)pBVar30 >> 0x38);
        local_268.field_1._16_4_ = iVar28;
        capnp::_::PointerReader::getStruct(&local_f0,(PointerReader *)&local_268,(word *)0x0);
        name_00._reader.capTable._0_4_ = uVar48;
        name_00._reader.segment = pSVar42;
        name_00._reader.capTable._4_4_ = in_stack_fffffffffffffb4c;
        name_00._reader.data._0_4_ = uVar33;
        name_00._reader.data._4_4_ = in_stack_fffffffffffffb54;
        name_00._reader.pointers._0_4_ = uVar50;
        name_00._reader.pointers._4_4_ = uVar53;
        name_00._reader.dataSize = uVar58;
        name_00._reader._36_4_ = uVar59;
        name_00._reader.nestingLimit = in_stack_fffffffffffffb68;
        name_00._reader._44_2_ = in_stack_fffffffffffffb6c;
        name_00._reader._46_2_ = in_stack_fffffffffffffb6e;
        expressionString(name_00);
        RVar55 = LocatedText::Reader::getValue((Reader *)&local_3f8);
        local_268._0_4_ = RVar55.super_StringPtr.content.ptr._0_4_;
        local_268._4_4_ = RVar55.super_StringPtr.content.ptr._4_4_;
        local_268.field_1.value.body.tag = RVar55.super_StringPtr.content.size_._0_4_;
        local_268.field_1._4_4_ = RVar55.super_StringPtr.content.size_._4_4_;
        kj::str<char_const(&)[2],kj::String,char_const(&)[24],capnp::Text::Reader,char_const(&)[2]>
                  ((String *)local_308,(kj *)0x26506b,(char (*) [2])&local_2a8,
                   (String *)"\' has no member named \'",&local_268.isSet,(Reader *)0x26506b,
                   (char (*) [2])local_f0.segment);
        pSVar36 = (SegmentReader *)local_308._0_8_;
        if (stack0xfffffffffffffd00 == (CapTableReader *)0x0) {
          pSVar36 = (SegmentReader *)0x2781dd;
        }
        uVar37 = 0;
        if (local_3f8.structDataSize < 0x20) {
          uVar41 = 0;
        }
        else {
          uVar41 = (ulong)*(uint *)local_3f8.ptr;
          if (0x3f < local_3f8.structDataSize) {
            uVar37 = (ulong)*(uint *)((long)local_3f8.ptr + 4);
          }
        }
        (**pEVar3->_vptr_ErrorReporter)
                  (pEVar3,uVar41,uVar37,pSVar36,
                   (long)&stack0xfffffffffffffd00->_vptr_CapTableReader +
                   (ulong)(stack0xfffffffffffffd00 == (CapTableReader *)0x0));
        kj::String::~String((String *)local_308);
        kj::String::~String(&local_2a8);
        (__return_storage_ptr__->ptr).isSet = false;
      }
      _Var27 = SUB41(uVar48,0);
    }
    else {
      (__return_storage_ptr__->ptr).isSet = false;
      _Var27 = local_3c8[0];
    }
    if (((byte)_Var27 & 1) == 0) {
      return __return_storage_ptr__;
    }
    if (local_440 == (BrandScope *)0x0) {
      return __return_storage_ptr__;
    }
    (**(pBStack_448->super_Refcounted).super_Disposer._vptr_Disposer)
              (pBStack_448,
               (_func_int *)
               ((long)&(local_440->super_Refcounted).super_Disposer._vptr_Disposer +
               (long)(local_440->super_Refcounted).super_Disposer._vptr_Disposer[-2]));
    return __return_storage_ptr__;
  case 0xb:
    bVar46 = source._reader.pointerCount == 0;
    if (bVar46) {
      pWVar32 = (WirePointer *)0x0;
    }
    uVar33 = source._reader.nestingLimit;
    if (bVar46) {
      uVar33 = 0x7fffffff;
    }
    uVar48 = 0;
    uVar50 = 0;
    uVar53 = 0;
    if (!bVar46) {
      uVar48 = (uint)source._reader.segment;
      uVar50 = (uint)source._reader.capTable;
      uVar53 = source._reader.capTable._4_4_;
    }
    uVar58 = SUB84(pWVar32,0);
    uVar59 = (undefined4)((ulong)pWVar32 >> 0x20);
    capnp::_::PointerReader::getStruct
              ((StructReader *)&local_3f8,(PointerReader *)&stack0xfffffffffffffb48,(word *)0x0);
    (*resolver->_vptr_Resolver[5])(&local_268);
    local_2f8 = (WirePointer *)0x0;
    iVar28 = 0x7fffffff;
    if (local_3f8.structPointerCount != 0) {
      local_2f8 = (WirePointer *)CONCAT44(local_3f8.step,local_3f8.elementCount);
      iVar28 = local_3f8.nestingLimit;
    }
    local_308._0_4_ = 0;
    local_308._4_4_ = 0;
    uVar49 = 0;
    uVar51 = 0;
    if (local_3f8.structPointerCount != 0) {
      local_308._0_4_ = local_3f8.segment._0_4_;
      local_308._4_4_ = local_3f8.segment._4_4_;
      uVar49 = local_3f8.capTable._0_4_;
      uVar51 = local_3f8.capTable._4_4_;
    }
    plVar7 = (long *)CONCAT17(local_268.field_1._31_1_,
                              CONCAT16(local_268.field_1._30_1_,
                                       CONCAT24(local_268.field_1._28_2_,local_268.field_1._24_4_)))
    ;
    stack0xfffffffffffffd00 = (CapTableReader *)CONCAT44(uVar51,uVar49);
    pWStack_2f0 = (WirePointer *)CONCAT44(pWStack_2f0._4_4_,iVar28);
    RVar55 = capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)local_308,(void *)0x0,0)
    ;
    (**(code **)(*plVar7 + 8))(&stack0xfffffffffffffb48,plVar7,RVar55.super_StringPtr.content.ptr);
    local_3c8[0] = SUB41(uVar48,0);
    if (SUB41(uVar48,0) != (_)0x1) {
      pEVar3 = this->errorReporter;
      RVar55 = capnp::_::PointerReader::getBlob<capnp::Text>
                         ((PointerReader *)&stack0xfffffffffffffb48,(void *)0x0,0);
      local_308._0_8_ = RVar55.super_StringPtr.content.ptr;
      register0x00000010 = (CapTableReader *)(RVar55.super_StringPtr.content.size_ - 1);
      kj::_::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                ((String *)&local_268,(_ *)&stack0xfffffffffffffb48,
                 (ArrayPtr<const_char> *)local_308,(ArrayPtr<const_char> *)local_308);
      lVar5 = CONCAT44(local_268.field_1._4_4_,local_268.field_1.value.body.tag);
      if (lVar5 == 0) {
        pcVar34 = "";
      }
      else {
        pcVar34 = (char *)CONCAT44(local_268._4_4_,local_268._0_4_);
      }
      uVar37 = 0;
      if (local_3f8.structDataSize < 0x20) {
        uVar41 = 0;
      }
      else {
        uVar41 = (ulong)*(uint *)local_3f8.ptr;
        if (0x3f < local_3f8.structDataSize) {
          uVar37 = (ulong)*(uint *)((long)local_3f8.ptr + 4);
        }
      }
      (**pEVar3->_vptr_ErrorReporter)(pEVar3,uVar41,uVar37,pcVar34,lVar5 + (ulong)(lVar5 == 0));
      lVar5 = CONCAT44(local_268._4_4_,local_268._0_4_);
      if (lVar5 != 0) {
        uVar6 = CONCAT44(local_268.field_1._4_4_,local_268.field_1.value.body.tag);
        local_268.isSet = false;
        local_268._1_3_ = 0;
        local_268._4_4_ = 0;
        local_268.field_1.value.body.tag = 0;
        local_268.field_1._4_4_ = 0;
        (*(code *)**(undefined8 **)CONCAT17(local_268.field_1._15_1_,local_268.field_1._8_7_))
                  ((undefined8 *)CONCAT17(local_268.field_1._15_1_,local_268.field_1._8_7_),lVar5,1,
                   uVar6,uVar6,0);
      }
      goto switchD_001c930a_caseD_0;
    }
    uVar49 = uVar58;
    uVar51 = uVar59;
    uVar54 = uVar33;
    if ((uVar50 != 2) &&
       (uVar49 = auStack_3c0._8_4_, uVar51 = auStack_3c0._12_4_, uVar54 = auStack_3c0._16_4_,
       uVar50 == 1)) {
      auStack_3c0._28_4_ =
           (undefined4)
           (CONCAT26(in_stack_fffffffffffffb6e,
                     CONCAT24(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68)) >> 0x20);
      uVar49 = uVar58;
      uVar51 = uVar59;
      uVar54 = uVar33;
      auStack_3c0._32_7_ = uVar10;
      auStack_3c0[0x27] = uVar11;
      auStack_3c0._40_7_ = uVar13;
      auStack_3c0[0x2f] = uVar15;
    }
    auStack_3c0._16_4_ = uVar54;
    auStack_3c0._12_4_ = uVar51;
    auStack_3c0._8_4_ = uVar49;
    auStack_3c0._0_4_ = uVar50;
    interpretResolve((BrandedDecl *)&stack0xfffffffffffffb48,this,resolver,
                     (ResolveResult *)auStack_3c0,source);
    break;
  case 0xc:
    bVar46 = source._reader.pointerCount == 0;
    if (bVar46) {
      pWVar32 = (WirePointer *)0x0;
    }
    uVar33 = source._reader.nestingLimit;
    if (bVar46) {
      uVar33 = 0x7fffffff;
    }
    uVar48 = 0;
    uVar50 = 0;
    uVar53 = 0;
    if (!bVar46) {
      uVar48 = (uint)source._reader.segment;
      uVar50 = (uint)source._reader.capTable;
      uVar53 = source._reader.capTable._4_4_;
    }
    _Var27 = SUB41(uVar48,0);
    uVar58 = SUB84(pWVar32,0);
    uVar59 = (undefined4)((ulong)pWVar32 >> 0x20);
    capnp::_::PointerReader::getStruct
              ((StructReader *)&local_268,(PointerReader *)&stack0xfffffffffffffb48,(word *)0x0);
    local_3f8.ptr = (byte *)0x0;
    local_3f8.elementCount = 0x7fffffff;
    if (local_268.field_1._28_2_ != 0) {
      local_3f8.ptr = (byte *)CONCAT44(local_268.field_1._20_4_,local_268.field_1._16_4_);
      local_3f8.elementCount = local_268.field_1._32_4_;
    }
    uVar48 = 0;
    uVar49 = 0;
    uVar51 = 0;
    uVar54 = 0;
    if (local_268.field_1._28_2_ != 0) {
      uVar48 = local_268._0_4_;
      uVar49 = local_268._4_4_;
      uVar51 = local_268.field_1.value.body.tag;
      uVar54 = local_268.field_1._4_4_;
    }
    local_3f8.segment = (SegmentReader *)CONCAT44(uVar49,uVar48);
    local_3f8.capTable = (CapTableReader *)CONCAT44(uVar54,uVar51);
    RVar55 = capnp::_::PointerReader::getBlob<capnp::Text>
                       ((PointerReader *)&local_3f8,(void *)0x0,0);
    (*resolver->_vptr_Resolver[8])
              (&stack0xfffffffffffffb48,resolver,RVar55.super_StringPtr.content.ptr);
    if (_Var27 != (_)0x1) {
      pEVar3 = this->errorReporter;
      RVar55 = capnp::_::PointerReader::getBlob<capnp::Text>
                         ((PointerReader *)&stack0xfffffffffffffb48,(void *)0x0,0);
      local_308._0_8_ = RVar55.super_StringPtr.content.ptr;
      register0x00000010 = (CapTableReader *)(RVar55.super_StringPtr.content.size_ - 1);
      kj::_::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                ((String *)&local_3f8,(_ *)&stack0xfffffffffffffb48,
                 (ArrayPtr<const_char> *)local_308,(ArrayPtr<const_char> *)local_308);
      pSVar36 = local_3f8.segment;
      if (local_3f8.capTable == (CapTableReader *)0x0) {
        pSVar36 = (SegmentReader *)0x2781dd;
      }
      uVar37 = 0;
      if ((uint)local_268.field_1._24_4_ < 0x20) {
        uVar41 = 0;
      }
      else {
        uVar41 = (ulong)*(uint *)CONCAT17(local_268.field_1._15_1_,local_268.field_1._8_7_);
        if (0x3f < (uint)local_268.field_1._24_4_) {
          uVar37 = (ulong)((uint *)CONCAT17(local_268.field_1._15_1_,local_268.field_1._8_7_))[1];
        }
      }
      (**pEVar3->_vptr_ErrorReporter)
                (pEVar3,uVar41,uVar37,pSVar36,
                 (long)&(local_3f8.capTable)->_vptr_CapTableReader +
                 (ulong)(local_3f8.capTable == (CapTableReader *)0x0));
      pCVar31 = local_3f8.capTable;
      pSVar36 = local_3f8.segment;
      if (local_3f8.segment != (SegmentReader *)0x0) {
        local_3f8.segment = (SegmentReader *)0x0;
        local_3f8.capTable = (CapTableReader *)0x0;
        (*(code *)**(undefined8 **)local_3f8.ptr)(local_3f8.ptr,pSVar36,1,pCVar31,pCVar31,0);
      }
      goto switchD_001c930a_caseD_0;
    }
    local_198 = CONCAT44(uVar33,uVar59);
    uStack_190 = CONCAT44(in_stack_fffffffffffffb68,in_stack_fffffffffffffb64);
    local_188 = CONCAT22(in_stack_fffffffffffffb6e,in_stack_fffffffffffffb6c);
    if (local_488 == '\x01') {
      auStack_3c0[0x1f] = (undefined1)local_460;
      auStack_3c0._32_7_ = (undefined7)((ulong)local_460 >> 8);
      auStack_3c0[0x27] = (undefined1)uStack_458;
      auStack_3c0._40_7_ = (undefined7)((ulong)uStack_458 >> 8);
      auStack_3c0[0xf] = (undefined1)local_470;
      auStack_3c0._16_4_ = (undefined4)((ulong)local_470 >> 8);
      auStack_3c0._20_3_ = (undefined3)((ulong)local_470 >> 0x28);
      auStack_3c0[0x17] = (undefined1)uStack_468;
      auStack_3c0._24_4_ = (undefined4)((ulong)uStack_468 >> 8);
      auStack_3c0._28_3_ = (undefined3)((ulong)uStack_468 >> 0x28);
      local_3c8[7] = local_480;
      auStack_3c0._0_4_ = (undefined4)uStack_47f;
      auStack_3c0._4_3_ = (undefined3)((uint7)uStack_47f >> 0x20);
      auStack_3c0[7] = (undefined1)uStack_478;
      auStack_3c0._8_4_ = (undefined4)((ulong)uStack_478 >> 8);
      auStack_3c0._12_3_ = (undefined3)((ulong)uStack_478 >> 0x28);
    }
    if (local_488 != '\0') {
      local_178 = CONCAT35(auStack_3c0._4_3_,CONCAT41(auStack_3c0._0_4_,local_3c8[7]));
      uStack_170 = CONCAT35(auStack_3c0._12_3_,CONCAT41(auStack_3c0._8_4_,auStack_3c0[7]));
      local_168 = CONCAT35(auStack_3c0._20_3_,CONCAT41(auStack_3c0._16_4_,auStack_3c0[0xf]));
      uStack_160 = CONCAT35(auStack_3c0._28_3_,CONCAT41(auStack_3c0._24_4_,auStack_3c0[0x17]));
      local_158 = CONCAT71(auStack_3c0._32_7_,auStack_3c0[0x1f]);
      uStack_150 = CONCAT71(auStack_3c0._40_7_,auStack_3c0[0x27]);
    }
    pEVar3 = this->errorReporter;
    pBVar30 = (BrandScope *)operator_new(0x50);
    BrandScope(pBVar30,pEVar3,CONCAT44(uVar53,uVar50),uVar58,(Resolver *)_uStack_490);
    puVar1 = &(pBVar30->super_Refcounted).refcount;
    *puVar1 = *puVar1 + 1;
    (__return_storage_ptr__->ptr).isSet = true;
    (__return_storage_ptr__->ptr).field_1.value.body.tag = 1;
    *(uint64_t *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = CONCAT44(uVar53,uVar50);
    *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1.value.body.field_1 + 8) = uVar58;
    *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x14) = local_198;
    *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x1c) = uStack_190;
    *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1.value.body.field_1 + 0x1c) =
         local_188;
    *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28) = _uStack_490;
    if (local_488 != '\0') {
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x58) = local_158;
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x60) = uStack_150;
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x48) = local_168;
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x50) = uStack_160;
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x38) = local_178;
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x40) = uStack_170;
    }
    *(undefined1 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x30) = local_488;
    (__return_storage_ptr__->ptr).field_1.value.brand.disposer = (Disposer *)pBVar30;
    (__return_storage_ptr__->ptr).field_1.value.brand.ptr = pBVar30;
    uStack_41c = source._reader._36_4_;
    goto LAB_001ca806;
  default:
    kj::_::unreachable();
  }
  (__return_storage_ptr__->ptr).isSet = true;
  (__return_storage_ptr__->ptr).field_1.value.body.tag = uVar48;
  if (uVar48 == 2) {
    *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = CONCAT44(uVar53,uVar50);
    *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) = CONCAT44(uVar59,uVar58);
  }
  else if (uVar48 == 1) {
    *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28) = _uStack_490;
    *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x18) =
         CONCAT44(in_stack_fffffffffffffb64,uVar33);
    *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) =
         CONCAT26(in_stack_fffffffffffffb6e,
                  CONCAT24(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
    *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = CONCAT44(uVar53,uVar50);
    *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) = CONCAT44(uVar59,uVar58);
    *(undefined1 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x30) = local_488;
    if (local_488 == '\x01') {
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x58) = local_460;
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x60) = uStack_458;
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x48) = local_470;
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x50) = uStack_468;
      *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x38) =
           CONCAT71(uStack_47f,local_480);
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x40) = uStack_478;
    }
  }
  (__return_storage_ptr__->ptr).field_1.value.brand.disposer = (Disposer *)local_450;
  (__return_storage_ptr__->ptr).field_1.value.brand.ptr = pBStack_448;
  source._reader.segment._0_4_ = (uint)local_440;
  source._reader.segment._4_4_ = local_440._4_4_;
  source._reader.capTable._0_4_ = uStack_438;
  source._reader.capTable._4_4_ = uStack_434;
  source._reader.data._0_4_ = local_430;
  source._reader.data._4_4_ = uStack_42c;
  source._reader.pointers._0_4_ = uStack_428;
  source._reader.pointers._4_4_ = uStack_424;
  source._reader.dataSize = local_420;
  source._reader.nestingLimit = SStack_418;
  source._reader._44_4_ = uStack_414;
LAB_001ca806:
  *(uint *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x78) = (uint)source._reader.segment;
  *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x7c) =
       source._reader.segment._4_4_;
  *(uint *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x80) = (uint)source._reader.capTable;
  *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x84) =
       source._reader.capTable._4_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x88) = source._reader.data._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x8c) = source._reader.data._4_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x90) =
       source._reader.pointers._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x94) =
       source._reader.pointers._4_4_;
  *(StructDataBitCount *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x98) =
       source._reader.dataSize;
  *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x9c) = uStack_41c;
  *(int *)((long)&(__return_storage_ptr__->ptr).field_1 + 0xa0) = source._reader.nestingLimit;
  *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0xa4) = source._reader._44_4_;
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<NodeTranslator::BrandedDecl> NodeTranslator::BrandScope::compileDeclExpression(
    Expression::Reader source, Resolver& resolver,
    ImplicitParams implicitMethodParams) {
  switch (source.which()) {
    case Expression::UNKNOWN:
      // Error reported earlier.
      return nullptr;

    case Expression::POSITIVE_INT:
    case Expression::NEGATIVE_INT:
    case Expression::FLOAT:
    case Expression::STRING:
    case Expression::BINARY:
    case Expression::LIST:
    case Expression::TUPLE:
    case Expression::EMBED:
      errorReporter.addErrorOn(source, "Expected name.");
      return nullptr;

    case Expression::RELATIVE_NAME: {
      auto name = source.getRelativeName();
      auto nameValue = name.getValue();

      // Check implicit method params first.
      for (auto i: kj::indices(implicitMethodParams.params)) {
        if (implicitMethodParams.params[i].getName() == nameValue) {
          if (implicitMethodParams.scopeId == 0) {
            return BrandedDecl::implicitMethodParam(i);
          } else {
            return BrandedDecl(Resolver::ResolvedParameter {
                implicitMethodParams.scopeId, static_cast<uint16_t>(i) },
                Expression::Reader());
          }
        }
      }

      KJ_IF_MAYBE(r, resolver.resolve(nameValue)) {
        return interpretResolve(resolver, *r, source);
      } else {
        errorReporter.addErrorOn(name, kj::str("Not defined: ", nameValue));
        return nullptr;
      }
    }

    case Expression::ABSOLUTE_NAME: {
      auto name = source.getAbsoluteName();
      KJ_IF_MAYBE(r, resolver.getTopScope().resolver->resolveMember(name.getValue())) {
        return interpretResolve(resolver, *r, source);
      } else {
        errorReporter.addErrorOn(name, kj::str("Not defined: ", name.getValue()));
        return nullptr;
      }
    }